

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O1

bool __thiscall
density::
conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
::reentrant_consume_operation::start_consume_impl
          (reentrant_consume_operation *this,PrivateType param_1,
          conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
          *i_queue)

{
  bool bVar1;
  unique_lock<std::mutex> new_lock;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_58;
  unique_lock<std::mutex> local_48;
  unique_lock<std::mutex> local_38;
  
  local_48._M_device = (mutex_type *)0x0;
  local_48._M_owns = false;
  local_58._M_device = &this->m_queue->m_mutex;
  if ((conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
       *)local_58._M_device !=
      (conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
       *)0x0) {
    local_58._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_58);
    local_58._M_owns = true;
    std::unique_lock<std::mutex>::operator=(&local_48,&local_58);
    std::unique_lock<std::mutex>::~unique_lock(&local_58);
  }
  local_58._M_device = (mutex_type *)0x0;
  local_58._M_owns = false;
  if (this->m_queue != i_queue) {
    local_38._M_owns = false;
    local_38._M_device = &i_queue->m_mutex;
    std::unique_lock<std::mutex>::lock(&local_38);
    local_38._M_owns = true;
    std::unique_lock<std::mutex>::operator=(&local_58,&local_38);
    std::unique_lock<std::mutex>::~unique_lock(&local_38);
  }
  if ((this->m_consume_operation).m_control != (ControlBlock *)0x0) {
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::reentrant_consume_operation::cancel(&this->m_consume_operation);
  }
  std::unique_lock<std::mutex>::operator=(&local_48,&local_58);
  this->m_queue = i_queue;
  bVar1 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_consume_operation::start_consume_impl
                    (&this->m_consume_operation,0,&i_queue->m_queue);
  std::unique_lock<std::mutex>::~unique_lock(&local_58);
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  return bVar1;
}

Assistant:

bool start_consume_impl(PrivateType, conc_heter_queue * i_queue)
            {
                DENSITY_ASSUME(i_queue != nullptr);

                // first we take the locks, because they may throw
                std::unique_lock<std::mutex> lock;
                if (m_queue != nullptr)
                {
                    lock = std::unique_lock<std::mutex>(m_queue->m_mutex);
                }
                std::unique_lock<std::mutex> new_lock;
                if (m_queue != i_queue && i_queue != nullptr)
                {
                    new_lock = std::unique_lock<std::mutex>(i_queue->m_mutex);
                }

                // nothing can throw from now on
                if (m_consume_operation)
                    m_consume_operation.cancel();
                lock    = std::move(new_lock);
                m_queue = i_queue;
                return m_queue->m_queue.try_start_reentrant_consume(m_consume_operation);
            }